

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

Matrix * MatrixZero(uint32_t rows,uint32_t columns)

{
  Real *pRVar1;
  Matrix *new;
  uint32_t columns_local;
  uint32_t rows_local;
  
  if ((rows == 0) || (columns == 0)) {
    fprintf(_stderr,"%s: Invalid dimension (%dx%d >= 1x1)\n","MatrixZero",(ulong)rows,(ulong)columns
           );
    _columns_local = (Matrix *)0x0;
  }
  else {
    _columns_local = (Matrix *)calloc(1,0x10);
    _columns_local->rows = rows;
    _columns_local->columns = columns;
    _columns_local->matrix = (Real *)0x0;
    pRVar1 = (Real *)calloc(1,(ulong)rows * 0x10 * (ulong)columns);
    _columns_local->matrix = pRVar1;
  }
  return _columns_local;
}

Assistant:

Matrix *MatrixZero(uint32_t rows, uint32_t columns) {
#ifndef NDEBUG
  if (rows == 0 || columns == 0) {
    fprintf(stderr, "%s: Invalid dimension (%dx%d >= 1x1)\n", __FUNCTION_NAME__, rows, columns);
    return NULL;
  }
#endif
  Matrix *new = (Matrix *)calloc(1, sizeof(Matrix));
  *new = (Matrix){rows, columns, NULL};
  new->matrix = (Real *)calloc(1, sizeof(Real) * rows * columns);
  return new;
}